

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O3

void __thiscall agge::tests::RectangleTests::RectangleIteratorListsItsVertices(RectangleTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FailedAssertion *pFVar3;
  long lVar4;
  rectangle r2;
  rectangle r1;
  undefined1 local_1f8 [8];
  undefined4 local_1f0;
  undefined8 local_1ec;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d4;
  undefined4 local_1cc;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined8 local_1bc;
  undefined4 local_1b4;
  undefined1 local_1a8 [44];
  int local_17c;
  pointer local_178;
  int local_170;
  pointer local_16c;
  int local_164;
  LocationInfo local_160;
  point local_138;
  undefined8 local_12c;
  undefined4 local_124;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_114;
  undefined4 local_10c;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_fc;
  undefined4 local_f4;
  point local_e8;
  real_t local_dc;
  real_t rStack_d8;
  int local_d4;
  point local_d0;
  point local_c4;
  point local_b8;
  point local_ac;
  string local_98;
  string local_78;
  rectangle local_58;
  rectangle local_44;
  
  rectangle::rectangle(&local_44,10.1,20.2,30.0,4.7);
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_e8.command = rectangle::vertex(&local_44,&local_138.x,&local_138.y);
  local_e8.x = local_138.x;
  local_e8.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_d4 = rectangle::vertex(&local_44,&local_138.x,&local_138.y);
  local_dc = local_138.x;
  rStack_d8 = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_d0.command = rectangle::vertex(&local_44,&local_138.x,&local_138.y);
  local_d0.x = local_138.x;
  local_d0.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_c4.command = rectangle::vertex(&local_44,&local_138.x,&local_138.y);
  local_c4.x = local_138.x;
  local_c4.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_b8.command = rectangle::vertex(&local_44,&local_138.x,&local_138.y);
  local_b8.x = local_138.x;
  local_b8.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_ac.command = rectangle::vertex(&local_44,&local_138.x,&local_138.y);
  local_ac.x = local_138.x;
  local_ac.y = local_138.y;
  local_138.x = 10.1;
  local_138.y = 20.2;
  local_138.command = 1;
  local_12c = 0x41a1999a41f00000;
  local_124 = 2;
  local_120 = 0x4096666641f00000;
  local_118 = 2;
  local_114 = 0x409666664121999a;
  local_10c = 2;
  local_108 = 0;
  local_100 = 0x30;
  local_fc = 0;
  local_f4 = 0;
  paVar1 = &local_160.filename.field_2;
  local_160.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1a8,&local_160.filename,0x76);
  lVar4 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_138.x + lVar4),(point *)((long)&local_e8.x + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_1f8 = (undefined1  [8])((long)&local_1ec + 4);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,(string *)local_1f8,(LocationInfo *)local_1a8);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x48);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.filename._M_dataplus._M_p);
  }
  rectangle::rectangle(&local_58,11.1,12.2,13.3,1.7);
  local_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_1a8._8_4_ = rectangle::vertex(&local_58,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_1a8._0_8_ = local_1f8;
  local_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_1a8._20_4_ = rectangle::vertex(&local_58,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_1a8._12_8_ = local_1f8;
  local_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_1a8._32_4_ = rectangle::vertex(&local_58,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_1a8._24_8_ = local_1f8;
  local_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_17c = rectangle::vertex(&local_58,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_1a8._36_8_ = local_1f8;
  local_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_170 = rectangle::vertex(&local_58,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_178 = (pointer)local_1f8;
  local_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_164 = rectangle::vertex(&local_58,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_16c = (pointer)local_1f8;
  local_1f8 = (undefined1  [8])0x414333334131999a;
  local_1f0 = 1;
  local_1ec = 0x414333334154cccd;
  local_1e4 = 2;
  local_1e0 = 0x3fd9999a4154cccd;
  local_1d8 = 2;
  local_1d4 = 0x3fd9999a4131999a;
  local_1cc = 2;
  local_1c8 = 0;
  local_1c0 = 0x30;
  local_1bc = 0;
  local_1b4 = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_160,&local_98,0x84);
  lVar4 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)(local_1f8 + lVar4),(point *)(local_1a8 + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,&local_78,&local_160);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( RectangleIteratorListsItsVertices )
			{
				// INIT
				rectangle r1(10.1f, 20.2f, 30.0f, 4.7f);

				// ACT
				mocks::path::point points1[] = { vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				rectangle r2(11.1f, 12.2f, 13.3f, 1.7f);

				// ACT
				mocks::path::point points2[] = { vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(11.1f, 12.2f), lineto(13.3f, 12.2f), lineto(13.3f, 1.7f), lineto(11.1f, 1.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference2, points2);
			}